

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDsd.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkSparsify(Abc_Ntk_t *pNtk,int nPerc,int fVerbose)

{
  int iVar1;
  Abc_Ntk_t *pNtkNew;
  int fVerbose_local;
  int nPerc_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsComb(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsComb(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDsd.c"
                  ,0x2aa,"Abc_Ntk_t *Abc_NtkSparsify(Abc_Ntk_t *, int, int)");
  }
  iVar1 = Abc_NtkIsBddLogic(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsBddLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDsd.c"
                  ,0x2ab,"Abc_Ntk_t *Abc_NtkSparsify(Abc_Ntk_t *, int, int)");
  }
  pNtk_local = Abc_NtkSparsifyInternal(pNtk,nPerc,fVerbose);
  if (pNtk_local == (Abc_Ntk_t *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    iVar1 = Abc_NtkCheck(pNtk_local);
    if (iVar1 == 0) {
      printf("Abc_NtkSparsify: The network check has failed.\n");
      Abc_NtkDelete(pNtk_local);
      pNtk_local = (Abc_Ntk_t *)0x0;
    }
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkSparsify( Abc_Ntk_t * pNtk, int nPerc, int fVerbose )
{
    Abc_Ntk_t * pNtkNew;
    assert( Abc_NtkIsComb(pNtk) );
    assert( Abc_NtkIsBddLogic(pNtk) );
    pNtkNew = Abc_NtkSparsifyInternal( pNtk, nPerc, fVerbose );
    if ( pNtkNew == NULL )
        return NULL;
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkSparsify: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}